

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QRegion __thiscall QRegion::subtracted(QRegion *this,QRegion *r)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QRegionPrivate *in_RDX;
  long *in_RSI;
  QRegionData *in_RDI;
  QRegion *result;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  bVar2 = isEmptyHelper(*(QRegionPrivate **)(*in_RSI + 8));
  if ((bVar2) || (bVar2 = isEmptyHelper(*(QRegionPrivate **)(*(long *)in_RDX + 8)), bVar2)) {
    QRegion((QRegion *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (QRegion *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    bVar2 = QRegionPrivate::contains
                      ((QRegionPrivate *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (QRegionPrivate *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar2) {
      QRegion((QRegion *)in_RDI);
    }
    else {
      iVar3 = QRect::right((QRect *)0x650540);
      iVar4 = QRect::left((QRect *)0x650559);
      if (iVar4 <= iVar3) {
        in_stack_ffffffffffffffc0 = QRect::left((QRect *)0x65057c);
        iVar4 = QRect::right((QRect *)0x650595);
        if (in_stack_ffffffffffffffc0 <= iVar4) {
          in_stack_ffffffffffffffbc = QRect::bottom((QRect *)0x6505b4);
          iVar4 = QRect::top((QRect *)0x6505cd);
          if (iVar4 <= in_stack_ffffffffffffffbc) {
            in_stack_ffffffffffffffb8 = QRect::top((QRect *)0x6505ec);
            iVar4 = QRect::bottom((QRect *)0x650604);
            if (in_stack_ffffffffffffffb8 <= iVar4) {
              lVar1._0_4_ = in_RDX->numRects;
              lVar1._4_4_ = in_RDX->innerArea;
              if ((*in_RSI != lVar1) &&
                 (bVar2 = EqualRegion(in_RDX,(QRegionPrivate *)
                                             CONCAT17(in_stack_ffffffffffffffe7,
                                                      in_stack_ffffffffffffffe0)), !bVar2)) {
                *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
                QRegion((QRegion *)in_RDI);
                detach((QRegion *)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
                SubtractRegion((QRegionPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                               (QRegionPrivate *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                               (QRegionPrivate *)0x6506ae);
                return (QRegion)in_RDI;
              }
              QRegion((QRegion *)in_RDI);
              return (QRegion)in_RDI;
            }
          }
        }
      }
      QRegion((QRegion *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
              (QRegion *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
  }
  return (QRegion)in_RDI;
}

Assistant:

QRegion QRegion::subtracted(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn) || isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (r.d->qt_rgn->contains(*d->qt_rgn))
        return QRegion();
    if (!EXTENTCHECK(&d->qt_rgn->extents, &r.d->qt_rgn->extents))
        return *this;
    if (d == r.d || EqualRegion(d->qt_rgn, r.d->qt_rgn))
        return QRegion();

#ifdef QT_REGION_DEBUG
    d->qt_rgn->selfTest();
    r.d->qt_rgn->selfTest();
#endif

    QRegion result;
    result.detach();
    SubtractRegion(d->qt_rgn, r.d->qt_rgn, *result.d->qt_rgn);
#ifdef QT_REGION_DEBUG
    result.d->qt_rgn->selfTest();
#endif
    return result;
}